

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void sysbvm_methodDictionary_insertNoCheck
               (sysbvm_tuple_t dictionary,sysbvm_tuple_t key,sysbvm_tuple_t value)

{
  long lVar1;
  intptr_t iVar2;
  sysbvm_array_t *storage;
  sysbvm_dictionary_t *dictionaryObject;
  intptr_t elementIndex;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t key_local;
  sysbvm_tuple_t dictionary_local;
  
  iVar2 = sysbvm_methodDictionary_scanFor(dictionary,key);
  if (iVar2 < 0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dictionary.c:662: assertion failure: elementIndex >= 0"
              );
  }
  lVar1 = *(long *)(dictionary + 0x18);
  *(sysbvm_tuple_t *)(lVar1 + 0x10 + iVar2 * 0x10) = key;
  *(sysbvm_tuple_t *)(lVar1 + 0x18 + iVar2 * 0x10) = value;
  return;
}

Assistant:

static void sysbvm_methodDictionary_insertNoCheck(sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    intptr_t elementIndex = sysbvm_methodDictionary_scanFor(dictionary, key);
    SYSBVM_ASSERT(elementIndex >= 0);

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    storage->elements[elementIndex*2] = key;
    storage->elements[elementIndex*2 + 1] = value;
}